

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O0

void counter_inc(counter *c,int increment)

{
  int increment_local;
  counter *c_local;
  
  if (increment != 0) {
    nsync_mu_lock(&c->mu);
    c->value = increment + c->value;
    if (c->value == 0) {
      nsync_cv_broadcast(&c->cv);
    }
    nsync_mu_unlock(&c->mu);
  }
  return;
}

Assistant:

static void counter_inc (counter *c, int increment) {
	if (increment != 0) {
		nsync_mu_lock (&c->mu);
		c->value += increment;
		if (c->value == 0) {
			nsync_cv_broadcast (&c->cv);
		}
		nsync_mu_unlock (&c->mu);
	}
}